

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O1

int weapon_dam_bonus(obj *weapon)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  skills sVar4;
  undefined *puVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  
  iVar2 = weapon_type(weapon);
  if ((u.twoweap == '\0') || ((iVar7 = 0x26, uwep != weapon && (uswapwep != weapon)))) {
    iVar7 = iVar2;
  }
  uVar8 = 0;
  if (iVar7 == 0) goto LAB_002856fd;
  if (iVar7 < 0x1e) {
    uVar8 = (uint)u.weapon_skills[iVar7].skill;
    if (4 < uVar8) {
      impossible("weapon_dam_bonus: bad skill %d");
      uVar8 = 0xfffffffb;
      goto LAB_002856fd;
    }
    uVar3 = (ulong)uVar8 & 0xff;
    puVar5 = &DAT_002d89c8;
  }
  else {
    if (iVar7 == 0x25) {
      sVar4.skill = '\x01';
      sVar4.max_skill = '\0';
      sVar4.advance = 0;
      if ('\x01' < u.weapon_skills[0x25].skill) {
        sVar4 = u.weapon_skills[0x25];
      }
      iVar2 = 3;
      if (urole.malenum != 0x165) {
        iVar2 = (urole.malenum == 0x160) + 1 + (uint)(urole.malenum == 0x160);
      }
      uVar8 = iVar2 * ((uint)sVar4 & 0xff) >> 1;
      goto LAB_002856fd;
    }
    uVar8 = 0;
    if (iVar7 != 0x26) goto LAB_002856fd;
    cVar1 = u.weapon_skills[iVar2].skill;
    cVar6 = u.weapon_skills[0x26].skill;
    if (cVar1 < u.weapon_skills[0x26].skill) {
      cVar6 = cVar1;
    }
    uVar8 = 0xfffffffd;
    if (2 < (byte)(cVar6 - 2U)) goto LAB_002856fd;
    uVar3 = (ulong)(byte)(cVar6 - 2U);
    puVar5 = &DAT_002d89dc;
  }
  uVar8 = *(uint *)(puVar5 + uVar3 * 4);
LAB_002856fd:
  if ((iVar7 != 0x26) && (u.usteed != (monst *)0x0)) {
    if (u.weapon_skills[0x27].skill == '\x04') {
      uVar8 = uVar8 + 5;
    }
    else if (u.weapon_skills[0x27].skill == '\x03') {
      uVar8 = uVar8 + 2;
    }
  }
  return uVar8;
}

Assistant:

int weapon_dam_bonus(struct obj *weapon)
{
    int type, wep_type, skill, bonus = 0;

    wep_type = weapon_type(weapon);
    /* use two weapon skill only if attacking with one of the wielded weapons */
    type = (u.twoweap && (weapon == uwep || weapon == uswapwep)) ?
	    P_TWO_WEAPON_COMBAT : wep_type;
    if (type == P_NONE) {
	bonus = 0;
    } else if (type <= P_LAST_WEAPON) {
	switch (P_SKILL(type)) {
	    default: impossible("weapon_dam_bonus: bad skill %d",P_SKILL(type));
		     /* fall through */
	    case P_ISRESTRICTED: bonus = -5; break;
	    case P_UNSKILLED:	bonus = -2; break;
	    case P_BASIC:	bonus =  0; break;
	    case P_SKILLED:	bonus =  1; break;
	    case P_EXPERT:	bonus =  3; break;
	}
    } else if (type == P_TWO_WEAPON_COMBAT) {
	skill = P_SKILL(P_TWO_WEAPON_COMBAT);
	if (P_SKILL(wep_type) < skill) skill = P_SKILL(wep_type);
	switch (skill) {
	    default:
	    case P_ISRESTRICTED:
	    case P_UNSKILLED:	bonus = -3; break;
	    case P_BASIC:	bonus = -1; break;
	    case P_SKILLED:	bonus = 0; break;
	    case P_EXPERT:	bonus = 2; break;
	}
    } else if (type == P_BARE_HANDED_COMBAT) {
	/*
	 *	       b.h.  m.a.
	 *	unskl:	 0   n/a
	 *	basic:	+1    +3
	 *	skild:	+1    +4
	 *	exprt:	+2    +6
	 *	mastr:	+2    +7
	 *	grand:	+3    +9
	 */
	bonus = P_SKILL(type);
	bonus = max(bonus,P_UNSKILLED) - 1;	/* unskilled => 0 */
	bonus = ((bonus + 1) * (martial_bonus() ? 3 : 1)) / 2;
    }

	/* KMH -- Riding gives some thrusting damage */
	if (u.usteed && type != P_TWO_WEAPON_COMBAT) {
		switch (P_SKILL(P_RIDING)) {
		    case P_ISRESTRICTED:
		    case P_UNSKILLED:   break;
		    case P_BASIC:       break;
		    case P_SKILLED:     bonus += 2; break;
		    case P_EXPERT:      bonus += 5; break;
		}
	}

    return bonus;
}